

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O3

void table_select(ge_precomp *t,int pos,char b)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined7 in_register_00000011;
  uint8_t (*paauVar8) [3] [32];
  uintptr_t a_u;
  ulong uVar9;
  uint8_t (*paauVar10) [3] [32];
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  uint8_t t_bytes [3] [32];
  fe xy2d;
  fe yminusx;
  fe yplusx;
  ge_precomp minust;
  undefined1 local_188 [4];
  uint auStack_184 [3];
  undefined1 local_178 [16];
  byte local_168;
  undefined1 auStack_167 [15];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  uint8_t local_128 [8];
  fe local_120;
  fe local_f8;
  fe local_d0;
  ge_precomp local_a8;
  
  iVar7 = (int)CONCAT71(in_register_00000011,b);
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_188[0] = (byte)((byte)((ulong)((long)iVar7 + -1) >> 0x38) & ~(byte)(iVar7 >> 0x1f)) >> 7;
  stack0xfffffffffffffe79 = SUB1615((undefined1  [16])0x0,1);
  auStack_167 = SUB1615((undefined1  [16])0x0,1);
  local_168 = local_188[0];
  paauVar8 = k25519Precomp[pos];
  uVar9 = 0;
  paauVar10 = paauVar8;
  do {
    if (paauVar8 + uVar9 < (uint8_t (*) [3] [32])local_128 &&
        (uint8_t (*) [3] [32])local_188 < paauVar8 + uVar9 + 1) {
      __assert_fail("!buffers_alias(dst, n, src, n)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/../internal.h"
                    ,0x1ab,
                    "void constant_time_conditional_memxor(void *, const void *, size_t, const crypto_word_t)"
                   );
    }
    uVar9 = uVar9 + 1;
    auVar13[3] = (char)((long)((uVar9 & 0xffffffff ^
                               (ulong)(byte)(b + ((byte)(iVar7 >> 7) & 0xff & b) * -2)) - 1) >> 0x3f
                       );
    auVar13[7] = auVar13[3];
    auVar13[6] = auVar13[3];
    auVar13[5] = auVar13[3];
    auVar13[4] = auVar13[3];
    auVar13[2] = auVar13[3];
    auVar13[1] = auVar13[3];
    auVar13[0] = auVar13[3];
    auVar13._8_8_ = 0;
    auVar13 = pshuflw(auVar13,auVar13,0);
    uVar12 = auVar13._0_4_;
    lVar11 = 0;
    do {
      puVar1 = (*(uint8_t (*) [3] [32])*paauVar10)[0] + lVar11;
      uVar4 = *(uint *)(puVar1 + 4);
      uVar5 = *(uint *)(puVar1 + 8);
      uVar6 = *(uint *)(puVar1 + 0xc);
      uVar2 = *(uint *)((long)auStack_184 + lVar11 + 4);
      uVar3 = *(uint *)(local_178 + lVar11 + -4);
      *(uint *)(local_188 + lVar11) = *(uint *)puVar1 & uVar12 ^ *(uint *)(local_188 + lVar11);
      *(uint *)((long)auStack_184 + lVar11) = uVar4 & uVar12 ^ *(uint *)((long)auStack_184 + lVar11)
      ;
      *(uint *)((long)auStack_184 + lVar11 + 4) = uVar5 & uVar12 ^ uVar2;
      *(uint *)(local_178 + lVar11 + -4) = uVar6 & uVar12 ^ uVar3;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x60);
    paauVar10 = paauVar10 + 1;
  } while (uVar9 != 8);
  fe_frombytes_strict(&local_d0,local_188);
  fe_frombytes_strict(&local_f8,&local_168);
  fe_frombytes_strict(&local_120,local_148);
  (t->yplusx).v[4] = local_d0.v[4];
  (t->yplusx).v[2] = local_d0.v[2];
  (t->yplusx).v[3] = local_d0.v[3];
  (t->yplusx).v[0] = local_d0.v[0];
  (t->yplusx).v[1] = local_d0.v[1];
  (t->yminusx).v[4] = local_f8.v[4];
  (t->yminusx).v[2] = local_f8.v[2];
  (t->yminusx).v[3] = local_f8.v[3];
  (t->yminusx).v[0] = local_f8.v[0];
  (t->yminusx).v[1] = local_f8.v[1];
  (t->xy2d).v[4] = local_120.v[4];
  (t->xy2d).v[2] = local_120.v[2];
  (t->xy2d).v[3] = local_120.v[3];
  (t->xy2d).v[0] = local_120.v[0];
  (t->xy2d).v[1] = local_120.v[1];
  local_a8.yplusx.v[4] = local_f8.v[4];
  local_a8.yplusx.v[2] = local_f8.v[2];
  local_a8.yplusx.v[3] = local_f8.v[3];
  local_a8.yplusx.v[0] = local_f8.v[0];
  local_a8.yplusx.v[1] = local_f8.v[1];
  local_a8.yminusx.v[0] = local_d0.v[0];
  local_a8.yminusx.v[1] = local_d0.v[1];
  local_a8.yminusx.v[2] = local_d0.v[2];
  local_a8.yminusx.v[3] = local_d0.v[3];
  local_a8.yminusx.v[4] = local_d0.v[4];
  fe_neg(&local_a8.xy2d,&local_120);
  cmov(t,&local_a8,(byte)((ulong)((long)iVar7 >> 0x3f) >> 7) & 1);
  return;
}

Assistant:

static void table_select(ge_precomp *t, const int pos, const signed char b) {
  uint8_t bnegative = constant_time_msb_w(b);
  uint8_t babs = b - ((bnegative & b) << 1);

  uint8_t t_bytes[3][32] = {
      {static_cast<uint8_t>(constant_time_is_zero_w(b) & 1)},
      {static_cast<uint8_t>(constant_time_is_zero_w(b) & 1)},
      {0}};
#if defined(__clang__)  // materialize for vectorization, 6% speedup
  __asm__("" : "+m"(t_bytes) : /*no inputs*/);
#endif
  static_assert(sizeof(t_bytes) == sizeof(k25519Precomp[pos][0]), "");
  for (int i = 0; i < 8; i++) {
    constant_time_conditional_memxor(t_bytes, k25519Precomp[pos][i],
                                     sizeof(t_bytes),
                                     constant_time_eq_w(babs, 1 + i));
  }

  fe yplusx, yminusx, xy2d;
  fe_frombytes_strict(&yplusx, t_bytes[0]);
  fe_frombytes_strict(&yminusx, t_bytes[1]);
  fe_frombytes_strict(&xy2d, t_bytes[2]);

  fe_copy_lt(&t->yplusx, &yplusx);
  fe_copy_lt(&t->yminusx, &yminusx);
  fe_copy_lt(&t->xy2d, &xy2d);

  ge_precomp minust;
  fe_copy_lt(&minust.yplusx, &yminusx);
  fe_copy_lt(&minust.yminusx, &yplusx);
  fe_neg(&minust.xy2d, &xy2d);
  cmov(t, &minust, bnegative >> 7);
}